

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gfxwrapper_opengl.c
# Opt level: O3

void ksGpuWindow_Destroy(ksGpuWindow *window)

{
  glXDestroyContext((window->context).xDisplay,(window->context).glxContext);
  (window->context).xDisplay = (Display *)0x0;
  (window->context).visualid = 0;
  (window->context).glxFBConfig = (GLXFBConfig)0x0;
  (window->context).glxDrawable = 0;
  (window->context).glxContext = (GLXContext)0x0;
  (window->device).instance = (ksDriverInstance *)0x0;
  (window->device).queueInfo.queueCount = 0;
  (window->device).queueInfo.queueProperties = 0;
  (window->device).queueInfo.queuePriorities[0] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[1] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[2] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[3] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[4] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[5] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[6] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[7] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[8] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[9] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[10] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[0xb] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[0xc] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[0xd] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[0xe] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[0xf] = KS_GPU_QUEUE_PRIORITY_LOW;
  if (window->windowFullscreen == true) {
    ChangeVideoMode_XF86VidMode
              (window->xDisplay,window->xScreen,(int *)0x0,(int *)0x0,(float *)0x0,
               &window->desktopWidth,&window->desktopHeight,&window->desktopRefreshRate);
    XUngrabPointer(window->xDisplay,0);
    XUngrabKeyboard(window->xDisplay,0);
  }
  if (window->xWindow != 0) {
    XUnmapWindow(window->xDisplay);
    XDestroyWindow(window->xDisplay,window->xWindow);
    window->xWindow = 0;
  }
  if (window->xColormap != 0) {
    XFreeColormap(window->xDisplay);
    window->xColormap = 0;
  }
  if (window->xVisual != (XVisualInfo *)0x0) {
    XFree();
    window->xVisual = (XVisualInfo *)0x0;
  }
  XFlush(window->xDisplay);
  XCloseDisplay(window->xDisplay);
  window->xDisplay = (Display *)0x0;
  return;
}

Assistant:

void ksGpuWindow_Destroy(ksGpuWindow *window) {
    ksGpuContext_Destroy(&window->context);
    ksGpuDevice_Destroy(&window->device);

    if (window->windowFullscreen) {
        ChangeVideoMode_XF86VidMode(window->xDisplay, window->xScreen, NULL, NULL, NULL, &window->desktopWidth,
                                    &window->desktopHeight, &window->desktopRefreshRate);

        XUngrabPointer(window->xDisplay, CurrentTime);
        XUngrabKeyboard(window->xDisplay, CurrentTime);
    }

    if (window->xWindow) {
        XUnmapWindow(window->xDisplay, window->xWindow);
        XDestroyWindow(window->xDisplay, window->xWindow);
        window->xWindow = 0;
    }

    if (window->xColormap) {
        XFreeColormap(window->xDisplay, window->xColormap);
        window->xColormap = 0;
    }

    if (window->xVisual) {
        XFree(window->xVisual);
        window->xVisual = NULL;
    }

    XFlush(window->xDisplay);
    XCloseDisplay(window->xDisplay);
    window->xDisplay = NULL;
}